

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O0

log_record log_handle_pop(log_handle handle)

{
  long lVar1;
  long lVar2;
  ulong __size;
  void *pvVar3;
  size_t sVar4;
  long *in_RDI;
  void *buffer;
  size_t new_size;
  log_record local_8;
  
  if (in_RDI[1] == 0) {
    local_8 = (log_record)0x0;
  }
  else {
    __size = (ulong)in_RDI[2] >> 1;
    in_RDI[1] = in_RDI[1] + -1;
    if ((0xff < __size) && ((ulong)in_RDI[1] < __size)) {
      pvVar3 = realloc((void *)*in_RDI,__size);
      if (pvVar3 == (void *)0x0) {
        return (log_record)0x0;
      }
      *in_RDI = (long)pvVar3;
      in_RDI[2] = __size;
    }
    lVar1 = *in_RDI;
    lVar2 = in_RDI[1];
    sVar4 = log_record_size();
    local_8 = (log_record)(lVar1 + lVar2 * sVar4);
  }
  return local_8;
}

Assistant:

log_record log_handle_pop(log_handle handle)
{
	if (handle->count > 0)
	{
		const size_t new_size = handle->size >> 0x01;

		--handle->count;

		if (new_size >= LOG_HANDLE_RECORD_SIZE_DEFAULT && handle->count < new_size)
		{
			register void *buffer = realloc(handle->buffer, new_size);

			if (buffer == NULL)
			{
				return NULL;
			}

			handle->buffer = buffer;

			handle->size = new_size;
		}

		return (void *const)((unsigned char *)(handle->buffer) + (handle->count * log_record_size()));
	}

	return NULL;
}